

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<0>::operator()
          (_defaultInitializer<0> *this,vector<Assimp::Blender::MCol> *out,char *param_2)

{
  vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_> local_48;
  vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_> local_28;
  
  local_28.super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl
  .super__Vector_impl_data._M_start =
       (out->super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>).
       super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (out->super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>).
       super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28.super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (out->super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>).
       super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (out->super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>).
  super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (out->super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>).
  super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (out->super_vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>).
  super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>::~vector(&local_28);
  ::std::vector<Assimp::Blender::MCol,_std::allocator<Assimp::Blender::MCol>_>::~vector(&local_48);
  return;
}

Assistant:

ElemBase()
    : dna_type(nullptr)
    {
        // empty
    }